

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Section::~Section(Section *this)

{
  char cVar1;
  IResultCapture *pIVar2;
  long lStack_80;
  SectionEndInfo endInfo;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Section_0056c470;
  if (this->m_sectionIncluded == true) {
    SectionInfo::SectionInfo(&endInfo.sectionInfo,&this->m_info);
    endInfo.prevAssertions.failedButOk = (this->m_assertions).failedButOk;
    endInfo.prevAssertions.passed = (this->m_assertions).passed;
    endInfo.prevAssertions.failed = (this->m_assertions).failed;
    endInfo.durationInSeconds = Timer::getElapsedSeconds(&this->m_timer);
    cVar1 = std::uncaught_exception();
    if (cVar1 == '\0') {
      pIVar2 = getResultCapture();
      lStack_80 = 0x18;
    }
    else {
      pIVar2 = getResultCapture();
      lStack_80 = 0x20;
    }
    (**(code **)((long)pIVar2->_vptr_IResultCapture + lStack_80))(pIVar2,&endInfo);
    SectionInfo::~SectionInfo(&endInfo.sectionInfo);
  }
  std::__cxx11::string::~string((string *)&this->m_name);
  SectionInfo::~SectionInfo(&this->m_info);
  return;
}

Assistant:

Section::~Section() {
        if( m_sectionIncluded ) {
            SectionEndInfo endInfo{ m_info, m_assertions, m_timer.getElapsedSeconds() };
            if( uncaught_exceptions() )
                getResultCapture().sectionEndedEarly( endInfo );
            else
                getResultCapture().sectionEnded( endInfo );
        }
    }